

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  char c_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  short sVar6;
  int iVar7;
  float scale_00;
  size_t sVar8;
  void *pvVar9;
  ImDrawCmd *pIVar10;
  float *in_RCX;
  float in_EDX;
  ImVector<ImDrawCmd> *in_RSI;
  ImFont *in_RDI;
  ImDrawList *in_R8;
  ImDrawList *in_R9;
  float in_XMM0_Da;
  float fVar11;
  float fVar12;
  float fVar13;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  byte in_stack_00000008;
  ImU32 glyph_col;
  float v2;
  float u2;
  float v1;
  float u1;
  float y2;
  float y1;
  float x2;
  float x1;
  float char_width;
  ImFontGlyph *glyph;
  uint c;
  char c_1;
  ImU32 col_untinted;
  uint vtx_current_idx;
  ImDrawIdx *idx_write;
  ImDrawVert *vtx_write;
  int idx_expected_size;
  int idx_count_max;
  int vtx_count_max;
  float y_end;
  char *s_end;
  char *s;
  char *word_wrap_eol;
  bool word_wrap_enabled;
  float line_height;
  float scale;
  float y;
  float x;
  float local_104;
  ImDrawList *local_100;
  int in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  ImDrawList *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  ImDrawList *in_stack_ffffffffffffff20;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float in_stack_ffffffffffffff54;
  ImFontGlyph *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImFont *this_00;
  ImDrawCmd *local_88;
  float local_74;
  ImDrawList *local_70;
  ImDrawList *local_68;
  ImDrawList *local_60;
  float local_48;
  float local_44;
  ImDrawList *local_38;
  
  local_38 = in_R9;
  if (in_R9 == (ImDrawList *)0x0) {
    in_stack_ffffffffffffff20 = in_R8;
    sVar8 = strlen((char *)in_R8);
    local_38 = (ImDrawList *)((long)&(in_stack_ffffffffffffff20->CmdBuffer).Size + sVar8);
  }
  fVar11 = (float)(int)in_XMM1_Da;
  local_48 = (float)(int)in_XMM1_Db;
  if (local_48 < in_RCX[3] || local_48 == in_RCX[3]) {
    fVar12 = in_XMM0_Da / in_RDI->FontSize;
    fVar13 = in_RDI->FontSize * fVar12;
    bVar2 = 0.0 < in_XMM2_Da;
    local_60 = (ImDrawList *)0x0;
    local_68 = in_R8;
    if ((local_48 + fVar13 < in_RCX[1]) && (!bVar2)) {
      for (; bVar5 = local_48 + fVar13 < in_RCX[1],
          in_stack_ffffffffffffff1f = bVar5 && local_68 < local_38, bVar5 && local_68 < local_38;
          local_48 = fVar13 + local_48) {
        pvVar9 = memchr(local_68,10,(long)local_38 - (long)local_68);
        in_stack_ffffffffffffff10 = local_38;
        if (pvVar9 != (void *)0x0) {
          in_stack_ffffffffffffff10 = (ImDrawList *)((long)pvVar9 + 1);
        }
        local_68 = in_stack_ffffffffffffff10;
      }
    }
    if ((10000 < (long)local_38 - (long)local_68) && (!bVar2)) {
      local_70 = local_68;
      local_74 = local_48;
      while( true ) {
        uVar4 = in_stack_ffffffffffffff0c & 0xffffff;
        if (local_74 < in_RCX[3]) {
          uVar4 = CONCAT13(local_70 < local_38,(int3)in_stack_ffffffffffffff0c);
        }
        in_stack_ffffffffffffff0c = uVar4;
        if ((char)(in_stack_ffffffffffffff0c >> 0x18) == '\0') break;
        pvVar9 = memchr(local_70,10,(long)local_38 - (long)local_70);
        if (pvVar9 == (void *)0x0) {
          local_100 = local_38;
        }
        else {
          local_100 = (ImDrawList *)((long)pvVar9 + 1);
        }
        local_70 = local_100;
        local_74 = fVar13 + local_74;
      }
      local_38 = local_70;
    }
    if (local_68 != local_38) {
      iVar3 = (int)local_68;
      iVar1 = in_RSI[1].Size;
      ImDrawList::PrimReserve
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      local_88 = in_RSI[4].Data;
      this_00 = *(ImFont **)(in_RSI + 5);
      scale_00 = (float)in_RSI[3].Capacity;
      local_44 = fVar11;
LAB_003485db:
      do {
        if (local_38 <= local_68) break;
        if (bVar2) {
          if ((local_60 == (ImDrawList *)0x0) &&
             (local_60 = (ImDrawList *)
                         CalcWordWrapPositionA
                                   (this_00,scale_00,
                                    (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                     in_stack_ffffffffffffff60),
                                    (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54),
             local_60 == local_68)) {
            local_60 = (ImDrawList *)((long)&(local_60->CmdBuffer).Size + 1);
          }
          if (local_60 <= local_68) {
            local_48 = fVar13 + local_48;
            local_60 = (ImDrawList *)0x0;
            for (; local_44 = fVar11, local_68 < local_38;
                local_68 = (ImDrawList *)((long)&(local_68->CmdBuffer).Size + 1)) {
              c_00 = (char)(local_68->CmdBuffer).Size;
              in_stack_ffffffffffffff64 = CONCAT13(c_00,(int3)in_stack_ffffffffffffff64);
              bVar5 = ImCharIsBlankA(c_00);
              if (!bVar5) {
                if ((char)((uint)in_stack_ffffffffffffff64 >> 0x18) == '\n') {
                  local_68 = (ImDrawList *)((long)&(local_68->CmdBuffer).Size + 1);
                }
                break;
              }
            }
            goto LAB_003485db;
          }
        }
        in_stack_ffffffffffffff60 = (uint)(char)(local_68->CmdBuffer).Size;
        if (in_stack_ffffffffffffff60 < 0x80) {
          local_68 = (ImDrawList *)((long)&(local_68->CmdBuffer).Size + 1);
        }
        else {
          iVar7 = ImTextCharFromUtf8((uint *)in_stack_ffffffffffffff20,
                                     (char *)CONCAT17(in_stack_ffffffffffffff1f,
                                                      in_stack_ffffffffffffff18),
                                     (char *)in_stack_ffffffffffffff10);
          local_68 = (ImDrawList *)((long)&(local_68->CmdBuffer).Size + (long)iVar7);
          if (in_stack_ffffffffffffff60 == 0) break;
        }
        if (0x1f < in_stack_ffffffffffffff60) {
LAB_00348815:
          in_stack_ffffffffffffff58 = FindGlyph(in_RDI,(ImWchar)in_stack_ffffffffffffff60);
          if (in_stack_ffffffffffffff58 != (ImFontGlyph *)0x0) {
            in_stack_ffffffffffffff54 = in_stack_ffffffffffffff58->AdvanceX * fVar12;
            if ((*(uint *)in_stack_ffffffffffffff58 >> 1 & 1) != 0) {
              local_b0 = in_stack_ffffffffffffff58->X0 * fVar12 + local_44;
              local_b4 = in_stack_ffffffffffffff58->X1 * fVar12 + local_44;
              local_b8 = in_stack_ffffffffffffff58->Y0 * fVar12 + local_48;
              local_bc = in_stack_ffffffffffffff58->Y1 * fVar12 + local_48;
              if ((local_b0 <= in_RCX[2]) && (*in_RCX <= local_b4)) {
                local_c0 = in_stack_ffffffffffffff58->U0;
                local_c4 = in_stack_ffffffffffffff58->V0;
                local_c8 = in_stack_ffffffffffffff58->U1;
                local_cc = in_stack_ffffffffffffff58->V1;
                if ((in_stack_00000008 & 1) != 0) {
                  if (local_b0 < *in_RCX) {
                    local_c0 = (1.0 - (local_b4 - *in_RCX) / (local_b4 - local_b0)) *
                               (local_c8 - local_c0) + local_c0;
                    local_b0 = *in_RCX;
                  }
                  if (local_b8 < in_RCX[1]) {
                    local_c4 = (1.0 - (local_bc - in_RCX[1]) / (local_bc - local_b8)) *
                               (local_cc - local_c4) + local_c4;
                    local_b8 = in_RCX[1];
                  }
                  if (in_RCX[2] <= local_b4 && local_b4 != in_RCX[2]) {
                    local_c8 = ((in_RCX[2] - local_b0) / (local_b4 - local_b0)) *
                               (local_c8 - local_c0) + local_c0;
                    local_b4 = in_RCX[2];
                  }
                  if (in_RCX[3] <= local_bc && local_bc != in_RCX[3]) {
                    local_cc = ((in_RCX[3] - local_b8) / (local_bc - local_b8)) *
                               (local_cc - local_c4) + local_c4;
                    local_bc = in_RCX[3];
                  }
                  if (local_bc <= local_b8) {
                    local_44 = in_stack_ffffffffffffff54 + local_44;
                    goto LAB_003485db;
                  }
                }
                local_104 = in_EDX;
                if (((undefined1  [40])*in_stack_ffffffffffffff58 & (undefined1  [40])0x1) !=
                    (undefined1  [40])0x0) {
                  local_104 = (float)((uint)in_EDX | 0xffffff);
                }
                sVar6 = SUB42(scale_00,0);
                *(short *)&(this_00->IndexAdvanceX).Size = sVar6;
                *(short *)((long)&(this_00->IndexAdvanceX).Size + 2) = sVar6 + 1;
                *(short *)&(this_00->IndexAdvanceX).Capacity = sVar6 + 2;
                *(short *)((long)&(this_00->IndexAdvanceX).Capacity + 2) = sVar6;
                *(short *)&(this_00->IndexAdvanceX).Data = sVar6 + 2;
                *(short *)((long)&(this_00->IndexAdvanceX).Data + 2) = sVar6 + 3;
                (local_88->ClipRect).x = local_b0;
                (local_88->ClipRect).y = local_b8;
                *(float *)&local_88->TextureId = local_104;
                (local_88->ClipRect).z = local_c0;
                (local_88->ClipRect).w = local_c4;
                *(float *)((long)&local_88->TextureId + 4) = local_b4;
                local_88->VtxOffset = (uint)local_b8;
                *(float *)&local_88->field_0x24 = local_104;
                local_88->IdxOffset = (uint)local_c8;
                local_88->ElemCount = (uint)local_c4;
                *(float *)&local_88->UserCallback = local_b4;
                *(float *)((long)&local_88->UserCallback + 4) = local_bc;
                local_88[1].ClipRect.x = local_104;
                *(float *)&local_88->UserCallbackData = local_c8;
                *(float *)((long)&local_88->UserCallbackData + 4) = local_cc;
                local_88[1].ClipRect.y = local_b0;
                local_88[1].ClipRect.z = local_bc;
                *(float *)((long)&local_88[1].TextureId + 4) = local_104;
                local_88[1].ClipRect.w = local_c0;
                *(float *)&local_88[1].TextureId = local_cc;
                local_88 = (ImDrawCmd *)&local_88[1].VtxOffset;
                scale_00 = (float)((int)scale_00 + 4);
                this_00 = (ImFont *)((long)&(this_00->IndexAdvanceX).Data + 4);
              }
            }
            local_44 = in_stack_ffffffffffffff54 + local_44;
          }
          goto LAB_003485db;
        }
        if (in_stack_ffffffffffffff60 != 10) {
          if (in_stack_ffffffffffffff60 != 0xd) goto LAB_00348815;
          goto LAB_003485db;
        }
        local_48 = fVar13 + local_48;
        local_44 = fVar11;
      } while (local_48 < in_RCX[3] || local_48 == in_RCX[3]);
      in_RSI[2].Size = (int)(((long)local_88 - (long)in_RSI[2].Data) / 0x14);
      in_RSI[1].Size = (int)((long)this_00 - (long)in_RSI[1].Data >> 1);
      iVar7 = in_RSI[1].Size;
      pIVar10 = ImVector<ImDrawCmd>::operator[](in_RSI,in_RSI->Size + -1);
      pIVar10->ElemCount = pIVar10->ElemCount - ((iVar1 + ((int)local_38 - iVar3) * 6) - iVar7);
      in_RSI[4].Data = local_88;
      *(ImFont **)(in_RSI + 5) = this_00;
      in_RSI[3].Capacity = (int)scale_00;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}